

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall van_kampen::Graph::removeOrientedEdge(Graph *this,nodeId_t a,nodeId_t b)

{
  anon_class_8_1_8991fb9c local_20;
  anon_class_8_1_8991fb9c maybeRemove;
  nodeId_t b_local;
  nodeId_t a_local;
  Graph *this_local;
  
  local_20.this = this;
  maybeRemove.this._0_4_ = b;
  maybeRemove.this._4_4_ = a;
  removeOrientedEdge::anon_class_8_1_8991fb9c::operator()(&local_20,a,b);
  removeOrientedEdge::anon_class_8_1_8991fb9c::operator()
            (&local_20,(nodeId_t)maybeRemove.this,maybeRemove.this._4_4_);
  return;
}

Assistant:

void Graph::removeOrientedEdge(nodeId_t a, nodeId_t b)
{
    auto maybeRemove = [this](nodeId_t x, nodeId_t y) {
        std::size_t id = 0;
        for (; id < node(x).transitions().size() && node(x).transitions()[id].to != y; ++id)
            ;
        if (id < node(x).transitions().size())
            node(x).transitions_.erase(node(x).transitions_.begin() + id);
    };
    maybeRemove(a, b);
    maybeRemove(b, a);
}